

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,char_type *value)

{
  int iVar1;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RDI;
  iterator iVar2;
  undefined4 in_stack_ffffffffffffff98;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_ffffffffffffffa0;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *this_00;
  cstring_spec_handler *in_stack_ffffffffffffffb0;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  local_40;
  size_t local_10;
  char local_8;
  
  if (in_RDI->specs_ == (format_specs *)0x0) {
    write(in_RDI,in_ESI,in_RDX,in_RCX);
    iVar2 = out(in_stack_ffffffffffffffa0);
    local_8 = iVar2.blackhole_;
  }
  else {
    iVar1 = (int)(in_RDI->specs_->super_core_format_specs).type;
    this_00 = &local_40;
    cstring_spec_handler::cstring_spec_handler
              (in_stack_ffffffffffffffb0,in_RDI,(char_type *)this_00);
    handle_cstring_type_spec<char,fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::cstring_spec_handler>
              ((char)((ulong)this_00 >> 0x38),
               (cstring_spec_handler *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
    iVar2 = out(this_00);
    local_8 = iVar2.blackhole_;
  }
  local_10 = iVar2.count_;
  iVar2.blackhole_ = local_8;
  iVar2.count_ = local_10;
  return iVar2;
}

Assistant:

iterator operator()(const char_type *value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(
          specs_->type, cstring_spec_handler(*this, value));
    return out();
  }